

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BGIP_SolverCreator_Random.h
# Opt level: O2

string * __thiscall
BGIP_SolverCreator_Random::SoftPrintBrief_abi_cxx11_
          (string *__return_storage_ptr__,BGIP_SolverCreator_Random *this)

{
  ostream *poVar1;
  stringstream ss;
  stringstream asStack_198 [16];
  ostream local_188 [376];
  
  std::__cxx11::stringstream::stringstream(asStack_198);
  poVar1 = std::operator<<(local_188,"BGIPSC_Random_nrSol");
  std::ostream::_M_insert<unsigned_long>((ulong)poVar1);
  std::__cxx11::stringbuf::str();
  std::__cxx11::stringstream::~stringstream(asStack_198);
  return __return_storage_ptr__;
}

Assistant:

std::string SoftPrintBrief() const
        {
            std::stringstream ss;
            ss << "BGIPSC_Random_nrSol" << _m_nrSolutions;
            return(ss.str());
        }